

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
DirectChainedMap<FunctionData_*>::insert
          (DirectChainedMap<FunctionData_*> *this,uint hash,FunctionData *value)

{
  Node *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  Node *pNVar3;
  
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  this->count = this->count + 1;
  pNVar1 = this->data + (ulong)(this->bucketCount - 1 & hash) * 0x18;
  if (*(long *)(pNVar1 + 0x10) == 0) {
    *(uint *)pNVar1 = hash;
    pNVar3 = pNVar1;
  }
  else {
    iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
    pNVar3 = (Node *)CONCAT44(extraout_var,iVar2);
    *(uint *)pNVar3 = *(uint *)pNVar1;
    *(undefined8 *)(pNVar3 + 8) = *(undefined8 *)(pNVar1 + 8);
    *(undefined8 *)(pNVar3 + 0x10) = *(undefined8 *)(pNVar1 + 0x10);
    *(uint *)pNVar1 = hash;
  }
  *(FunctionData **)(pNVar1 + 8) = value;
  *(Node **)(pNVar1 + 0x10) = pNVar3;
  return;
}

Assistant:

void insert(unsigned hash, Value value)
	{
		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		count++;

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *target = &data[bucket];

		if(target->next == NULL)
		{
			target->hash = hash;
			target->value = value;
			target->next = target; // Cycle lets us know that this is the last node
		}
		else
		{
			Node *n = (Node*)allocator->alloc(sizeof(Node));

			n->hash = target->hash;
			n->value = target->value;
			n->next = target->next;

			target->hash = hash;
			target->value = value;
			target->next = n;
		}
	}